

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QName.cpp
# Opt level: O3

XSerializable * xercesc_4_0::QName::createObject(MemoryManager *manager)

{
  QName *this;
  
  this = (QName *)XMemory::operator_new(0x48,manager);
  QName(this,manager);
  return &this->super_XSerializable;
}

Assistant:

void QName::serialize(XSerializeEngine& serEng)
{

    if (serEng.isStoring())
    {
        serEng.writeString(fPrefix, fPrefixBufSz, XSerializeEngine::toWriteBufferLen);

        serEng.writeString(fLocalPart, fLocalPartBufSz, XSerializeEngine::toWriteBufferLen);

        //do not serialize rawName

        serEng<<fURIId;
    }
    else
    {
        XMLSize_t dataLen = 0;

        serEng.readString(fPrefix, fPrefixBufSz, dataLen, XSerializeEngine::toReadBufferLen);

        serEng.readString(fLocalPart, fLocalPartBufSz, dataLen, XSerializeEngine::toReadBufferLen);

        //force raw name rebuilt
        fRawNameBufSz = 0;        
        fRawName = 0;

        serEng>>fURIId;
    }

}